

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O3

void ra_insert_new_key_value_at
               (roaring_array_t *ra,int32_t i,uint16_t key,container_t *c,uint8_t typecode)

{
  long lVar1;
  
  extend_array(ra,1);
  lVar1 = (long)i;
  memmove(ra->keys + lVar1 + 1,ra->keys + lVar1,(ra->size - lVar1) * 2);
  memmove(ra->containers + lVar1 + 1,ra->containers + lVar1,(ra->size - lVar1) * 8);
  memmove(ra->typecodes + lVar1 + 1,ra->typecodes + lVar1,ra->size - lVar1);
  ra->keys[lVar1] = key;
  ra->containers[lVar1] = c;
  ra->typecodes[lVar1] = typecode;
  ra->size = ra->size + 1;
  return;
}

Assistant:

void ra_insert_new_key_value_at(roaring_array_t *ra, int32_t i, uint16_t key,
                                container_t *c, uint8_t typecode) {
    extend_array(ra, 1);
    // May be an optimization opportunity with DIY memmove
    memmove(&(ra->keys[i + 1]), &(ra->keys[i]),
            sizeof(uint16_t) * (ra->size - i));
    memmove(&(ra->containers[i + 1]), &(ra->containers[i]),
            sizeof(container_t *) * (ra->size - i));
    memmove(&(ra->typecodes[i + 1]), &(ra->typecodes[i]),
            sizeof(uint8_t) * (ra->size - i));
    ra->keys[i] = key;
    ra->containers[i] = c;
    ra->typecodes[i] = typecode;
    ra->size++;
}